

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O1

string * __thiscall
argParserAdvancedConfiguration::generateAutoCompletion_abi_cxx11_
          (string *__return_storage_ptr__,argParserAdvancedConfiguration *this)

{
  long lVar1;
  ulong *puVar2;
  pointer pcVar3;
  pointer ppsVar4;
  long *plVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  long *plVar8;
  size_type *psVar9;
  ulong uVar10;
  long *plVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string topLevelArgs;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"#/usr/bin/env bash\n_function()\n{\n\n","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if ((this->newargconfig->
      super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (this->newargconfig->
      super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    plVar11 = (long *)0x0;
    do {
      ppsVar4 = (this->newargconfig->
                super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((long *)((long)(this->newargconfig->
                         super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar4 >> 3) <=
          plVar11) {
LAB_0010ac15:
        uVar7 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,plVar11);
        if (local_d8 != plVar11) {
          operator_delete(local_d8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != local_78) {
          operator_delete(pcVar3);
        }
        _Unwind_Resume(uVar7);
      }
      uVar10 = 0;
      while (lVar1 = *(long *)&(ppsVar4[(long)plVar11]->arguments->
                               super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                               )._M_impl.super__Vector_impl_data,
            uVar10 < (ulong)((long)*(pointer *)
                                    ((long)&(ppsVar4[(long)plVar11]->arguments->
                                            super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                                            )._M_impl.super__Vector_impl_data + 8) - lVar1 >> 3)) {
        puVar2 = *(ulong **)(lVar1 + uVar10 * 8);
        local_d8 = &local_c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,puVar2[4],puVar2[5] + puVar2[4]);
        std::__cxx11::string::append((char *)&local_d8);
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_d8);
        if (local_d8 != &local_c8) {
          operator_delete(local_d8);
        }
        std::operator+(&local_50,"if [ \"${COMP_WORDS[${COMP_CWORD} -1 ]}\" == \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (puVar2 + 4));
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_98 = &local_88;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_88 = *plVar8;
          lStack_80 = plVar5[3];
        }
        else {
          local_88 = *plVar8;
          local_98 = (long *)*plVar5;
        }
        local_90 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_98,*puVar2);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_b8.field_2._M_allocated_capacity = *psVar9;
          local_b8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar9;
          local_b8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_b8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_c8 = *plVar8;
          lStack_c0 = plVar5[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *plVar8;
          local_d8 = (long *)*plVar5;
        }
        local_d0 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d8);
        if (local_d8 != &local_c8) {
          operator_delete(local_d8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((char)puVar2[0x14] == '\x01') {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          std::operator+(&local_b8,"     COMPREPLY=($(compgen -W \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (puVar2 + 0x10));
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
          plVar5 = puVar6 + 2;
          if ((long *)*puVar6 == plVar5) {
            local_c8 = *plVar5;
            lStack_c0 = puVar6[3];
            local_d8 = &local_c8;
          }
          else {
            local_c8 = *plVar5;
            local_d8 = (long *)*puVar6;
          }
          local_d0 = puVar6[1];
          *puVar6 = plVar5;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d8);
          if (local_d8 != &local_c8) {
            operator_delete(local_d8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar10 = uVar10 + 1;
        ppsVar4 = (this->newargconfig->
                  super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((long *)((long)(this->newargconfig->
                           super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar4 >> 3) <=
            plVar11) goto LAB_0010ac15;
      }
      plVar11 = (long *)((long)plVar11 + 1);
    } while (plVar11 < (long *)((long)(this->newargconfig->
                                      super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->newargconfig->
                                      super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::operator+(&local_b8,"se\n     COMPREPLY=($(compgen -W \"",&local_70);
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_b8);
  plVar5 = plVar11 + 2;
  if ((long *)*plVar11 == plVar5) {
    local_c8 = *plVar5;
    lStack_c0 = plVar11[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar5;
    local_d8 = (long *)*plVar11;
  }
  local_d0 = plVar11[1];
  *plVar11 = (long)plVar5;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d8);
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&autoCompletionScript_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string argParserAdvancedConfiguration::generateAutoCompletion() {

    string script = "#/usr/bin/env bash\n_function()\n{\n\n";
    argument * arg;
    string topLevelArgs;
    for (int i = 0; i < newargconfig->size(); i++) {
        for(int y = 0; y<newargconfig->at(i)->arguments->size();y++){
            arg = newargconfig->at(i)->arguments->at(y);
            topLevelArgs += arg->argLong + " ";
            script += R"(if [ "${COMP_WORDS[${COMP_CWORD} -1 ]}" == ")" + arg->argLong +
                      R"(" ] || [ "${COMP_WORDS[${COMP_CWORD} -1 ]}" == ")" + arg->argShort +
                      "\" ]; then\n";
            if (arg->enumIsFile) {
                script += "    compopt -o nospace -o dirnames -o filenames\n"
                          "    COMPREPLY=($(compgen  -f \"${COMP_WORDS[${COMP_CWORD}]}\"))      \n";
            } else {
                script += "     COMPREPLY=($(compgen -W \"" + arg->enums +
                          "\" -- \"${COMP_WORDS[${COMP_CWORD}]}\"))   \n";
            }
            script += "\n   el";
        }
    }


    script += "se\n     COMPREPLY=($(compgen -W \"" + topLevelArgs + "\" -- \"${COMP_WORDS[${COMP_CWORD}]}\"))   \n";
    script += "  fi\n compgen -o bashdefault\n}\n";
    script += "complete -F _function ";
    autoCompletionScript = script;
    return script;

}